

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::SignedCastExpressionSyntax::setChild
          (SignedCastExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffff98;
  ParenthesizedExpressionSyntax *local_60;
  ParenthesizedExpressionSyntax *local_40;
  not_null<slang::syntax::ParenthesizedExpressionSyntax_*> local_38;
  undefined8 local_30;
  Info *local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x28) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x30) = local_28;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x3c507f);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_60 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x3c508f);
      local_60 = SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(pSVar1);
    }
    local_40 = local_60;
    not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::
    not_null<slang::syntax::ParenthesizedExpressionSyntax_*>(&local_38,&local_40);
    *(ParenthesizedExpressionSyntax **)(in_RDI + 0x38) = local_38.ptr;
  }
  return;
}

Assistant:

void SignedCastExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: signing = child.token(); return;
        case 1: apostrophe = child.token(); return;
        case 2: inner = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}